

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::CompilerMSL::get_or_allocate_builtin_input_member_location
          (CompilerMSL *this,BuiltIn builtin,uint32_t type_id,uint32_t index,uint32_t *comp)

{
  CompilerMSL *this_00;
  uint32_t uVar1;
  uint uVar2;
  key_type kVar3;
  uint32_t argument;
  uint32_t uVar4;
  SPIRType *pSVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  uint uVar8;
  bool bVar9;
  key_type local_54;
  TypeID local_50;
  uint32_t local_4c;
  SPIRType *local_48;
  ulong local_40;
  CompilerMSL *local_38;
  
  argument = get_member_location(this,type_id,index,comp);
  if (argument == 0xffffffff) {
    if (comp != (uint32_t *)0x0) {
      *comp = 0xffffffff;
    }
    local_50.id = type_id;
    local_40 = (ulong)builtin;
    pSVar5 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + type_id);
    local_4c = index;
    local_48 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr +
                          (pSVar5->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[index].
                          id);
    uVar4 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,local_48);
    uVar1 = 0;
    local_38 = this;
    do {
      argument = uVar1;
      bVar9 = uVar4 != 0;
      if ((uVar4 != 0) &&
         (local_54 = argument,
         sVar6 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&(this->location_inputs_in_use)._M_h,&local_54), sVar6 == 0)) {
        uVar2 = 1;
        do {
          uVar8 = uVar2;
          if (uVar4 == uVar8) break;
          local_54 = argument + uVar8;
          sVar6 = ::std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&(this->location_inputs_in_use)._M_h,&local_54);
          uVar2 = uVar8 + 1;
        } while (sVar6 == 0);
        bVar9 = uVar8 < uVar4;
      }
      this_00 = local_38;
      uVar1 = argument + 1;
    } while (bVar9);
    Compiler::set_member_decoration
              ((Compiler *)local_38,local_50,local_4c,DecorationLocation,argument);
    kVar3 = (key_type)local_40;
    if (((this_00->msl_options).raw_buffer_tese_input == false) &&
       (bVar9 = Compiler::is_tessellating_triangles((Compiler *)this_00), kVar3 - 0xb < 2 && bVar9))
    {
      local_54 = 0xc;
      pmVar7 = ::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this_00->builtin_to_automatic_input_location,&local_54);
      *pmVar7 = argument;
      local_54 = 0xb;
      kVar3 = local_54;
    }
    local_54 = kVar3;
    pmVar7 = ::std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this_00->builtin_to_automatic_input_location,&local_54);
    *pmVar7 = argument;
    mark_location_as_used_by_shader(this_00,argument,local_48,StorageClassInput,true);
  }
  return argument;
}

Assistant:

uint32_t CompilerMSL::get_or_allocate_builtin_input_member_location(spv::BuiltIn builtin,
                                                                    uint32_t type_id, uint32_t index,
                                                                    uint32_t *comp)
{
	uint32_t loc = get_member_location(type_id, index, comp);
	if (loc != k_unknown_location)
		return loc;

	if (comp)
		*comp = k_unknown_component;

	// Late allocation. Find a location which is unused by the application.
	// This can happen for built-in inputs in tessellation which are mixed and matched with user inputs.
	auto &mbr_type = get<SPIRType>(get<SPIRType>(type_id).member_types[index]);
	uint32_t count = type_to_location_count(mbr_type);

	loc = 0;

	const auto location_range_in_use = [this](uint32_t location, uint32_t location_count) -> bool {
		for (uint32_t i = 0; i < location_count; i++)
			if (location_inputs_in_use.count(location + i) != 0)
				return true;
		return false;
	};

	while (location_range_in_use(loc, count))
		loc++;

	set_member_decoration(type_id, index, DecorationLocation, loc);

	// Triangle tess level inputs are shared in one packed float4,
	// mark both builtins as sharing one location.
	if (!msl_options.raw_buffer_tese_input && is_tessellating_triangles() &&
	    (builtin == BuiltInTessLevelInner || builtin == BuiltInTessLevelOuter))
	{
		builtin_to_automatic_input_location[BuiltInTessLevelInner] = loc;
		builtin_to_automatic_input_location[BuiltInTessLevelOuter] = loc;
	}
	else
		builtin_to_automatic_input_location[builtin] = loc;

	mark_location_as_used_by_shader(loc, mbr_type, StorageClassInput, true);
	return loc;
}